

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void uv_disable_stdio_inheritance(void)

{
  int iVar1;
  undefined4 local_c;
  int fd;
  
  local_c = 0;
  while( true ) {
    iVar1 = uv__cloexec_ioctl(local_c,1);
    if ((iVar1 != 0) && (0xf < local_c)) break;
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void uv_disable_stdio_inheritance(void) {
  int fd;

  /* Set the CLOEXEC flag on all open descriptors. Unconditionally try the
   * first 16 file descriptors. After that, bail out after the first error.
   */
  for (fd = 0; ; fd++)
    if (uv__cloexec(fd, 1) && fd > 15)
      break;
}